

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

int __thiscall
v_hashmap<substring,_unsigned_long>::init
          (v_hashmap<substring,_unsigned_long> *this,EVP_PKEY_CTX *ctx)

{
  _func_bool_substring_ptr_substring_ptr *in_RDX;
  size_t in_stack_000001c8;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *in_stack_000001d0;
  
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize
            (in_stack_000001d0,in_stack_000001c8);
  this->equivalent = (_func_bool_void_ptr_substring_ptr_substring_ptr *)0x0;
  this->equivalent_no_data = in_RDX;
  this->eq_data = (void *)0x0;
  this->last_position = 0;
  this->num_occupants = 0;
  return (int)this;
}

Assistant:

void init(size_t min_size, bool (*eq)(const K&, const K&))
  {
    if (min_size < 1023)
      min_size = 1023;
    dat.resize(min_size);  // resize sets to 0 ==> occupied=false

    equivalent = nullptr;
    equivalent_no_data = eq;
    eq_data = nullptr;

    last_position = 0;
    num_occupants = 0;
  }